

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm128.c
# Opt level: O0

int CRYPTO_ccm128_decrypt_ccm64
              (CCM128_CONTEXT *ctx,uchar *inp,uchar *out,size_t len,ccm128_f stream)

{
  byte bVar1;
  ulong uVar2;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  ulong inc;
  byte *in_RDI;
  code *in_R8;
  anon_union_16_2_94730053 scratch;
  void *key;
  block128_f block;
  uchar flags0;
  uint L;
  uint i;
  size_t n;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  code *local_50;
  byte local_41;
  uint local_40;
  uint local_3c;
  ulong local_38;
  code *local_30;
  ulong local_28;
  long local_20;
  long local_18;
  byte *local_10;
  int local_4;
  
  local_41 = *in_RDI;
  local_50 = *(code **)(in_RDI + 0x28);
  local_58 = *(undefined8 *)(in_RDI + 0x30);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((local_41 & 0x40) == 0) {
    (*local_50)(in_RDI,in_RDI + 0x10,local_58);
  }
  local_40 = local_41 & 7;
  *local_10 = (byte)local_40;
  local_38 = 0;
  for (local_3c = 0xf - local_40; local_3c < 0xf; local_3c = local_3c + 1) {
    bVar1 = local_10[local_3c];
    local_10[local_3c] = 0;
    local_38 = (bVar1 | local_38) << 8;
  }
  bVar1 = local_10[0xf];
  local_10[0xf] = 1;
  if ((bVar1 | local_38) == local_28) {
    local_38 = local_28 >> 4;
    uVar2 = local_38;
    if (local_38 != 0) {
      (*local_30)(local_18,local_20,local_38,local_58,local_10,local_10 + 0x10);
      uVar2 = local_38 * 0x10;
      local_18 = uVar2 + local_18;
      local_20 = uVar2 + local_20;
      local_28 = local_28 + local_38 * -0x10;
      if (local_28 != 0) {
        inc = local_38 & 0xfffffffffffffff;
        local_38 = uVar2;
        ctr64_add(local_10,inc);
        uVar2 = local_38;
      }
    }
    local_38 = uVar2;
    if (local_28 != 0) {
      (*local_50)(local_10,&local_68,local_58);
      for (local_3c = 0; local_3c < local_28; local_3c = local_3c + 1) {
        bVar1 = *(byte *)((long)&local_68 + (ulong)local_3c) ^ *(byte *)(local_18 + (ulong)local_3c)
        ;
        *(byte *)(local_20 + (ulong)local_3c) = bVar1;
        local_10[(ulong)local_3c + 0x10] = local_10[(ulong)local_3c + 0x10] ^ bVar1;
      }
      (*local_50)(local_10 + 0x10,local_10 + 0x10,local_58);
    }
    for (local_3c = 0xf - local_40; local_3c < 0x10; local_3c = local_3c + 1) {
      local_10[local_3c] = 0;
    }
    (*local_50)(local_10,&local_68,local_58);
    *(ulong *)(local_10 + 0x10) = local_68 ^ *(ulong *)(local_10 + 0x10);
    *(ulong *)(local_10 + 0x18) = local_60 ^ *(ulong *)(local_10 + 0x18);
    *local_10 = local_41;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int CRYPTO_ccm128_decrypt_ccm64(CCM128_CONTEXT *ctx,
                                const unsigned char *inp, unsigned char *out,
                                size_t len, ccm128_f stream)
{
    size_t n;
    unsigned int i, L;
    unsigned char flags0 = ctx->nonce.c[0];
    block128_f block = ctx->block;
    void *key = ctx->key;
    union {
        u64 u[2];
        u8 c[16];
    } scratch;

    if (!(flags0 & 0x40))
        (*block) (ctx->nonce.c, ctx->cmac.c, key);

    ctx->nonce.c[0] = L = flags0 & 7;
    for (n = 0, i = 15 - L; i < 15; ++i) {
        n |= ctx->nonce.c[i];
        ctx->nonce.c[i] = 0;
        n <<= 8;
    }
    n |= ctx->nonce.c[15];      /* reconstructed length */
    ctx->nonce.c[15] = 1;

    if (n != len)
        return -1;

    if ((n = len / 16)) {
        (*stream) (inp, out, n, key, ctx->nonce.c, ctx->cmac.c);
        n *= 16;
        inp += n;
        out += n;
        len -= n;
        if (len)
            ctr64_add(ctx->nonce.c, n / 16);
    }

    if (len) {
        (*block) (ctx->nonce.c, scratch.c, key);
        for (i = 0; i < len; ++i)
            ctx->cmac.c[i] ^= (out[i] = scratch.c[i] ^ inp[i]);
        (*block) (ctx->cmac.c, ctx->cmac.c, key);
    }

    for (i = 15 - L; i < 16; ++i)
        ctx->nonce.c[i] = 0;

    (*block) (ctx->nonce.c, scratch.c, key);
    ctx->cmac.u[0] ^= scratch.u[0];
    ctx->cmac.u[1] ^= scratch.u[1];

    ctx->nonce.c[0] = flags0;

    return 0;
}